

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3DoclistOrMerge(int bDescDoclist,char *a1,int n1,char *a2,int n2,char **paOut,int *pnOut)

{
  char *p;
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pEnd;
  long in_FS_OFFSET;
  int bFirstOut;
  char *local_68;
  char *p2;
  char *p1;
  sqlite3_int64 iPrev;
  sqlite3_int64 i2;
  sqlite3_int64 i1;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  i1 = 0;
  i2 = 0;
  iPrev = 0;
  bFirstOut = 0;
  *paOut = (char *)0x0;
  *pnOut = 0;
  p2 = a2;
  p1 = a1;
  p = (char *)sqlite3_malloc64((long)n1 + (long)n2 + 0x11);
  if (p == (char *)0x0) {
    iVar2 = 7;
  }
  else {
    pcVar3 = a1 + n1;
    pEnd = a2 + n2;
    local_68 = p;
    fts3GetDeltaVarint3(&p1,pcVar3,0,&i1);
    fts3GetDeltaVarint3(&p2,pEnd,0,&i2);
    while( true ) {
      if (p1 == (char *)0x0 && p2 == (char *)0x0) break;
      iVar2 = -(uint)(i1 != i2);
      if (i2 < i1) {
        iVar2 = 1;
      }
      iVar1 = -iVar2;
      if (bDescDoclist == 0) {
        iVar1 = iVar2;
      }
      if (((p1 == (char *)0x0) || (p2 == (char *)0x0)) || (iVar1 != 0)) {
        if ((p2 == (char *)0x0) || (p1 != (char *)0x0 && iVar1 < 0)) {
          fts3PutDeltaVarint3(&local_68,bDescDoclist,&iPrev,&bFirstOut,i1);
          fts3PoslistCopy(&local_68,&p1);
          fts3GetDeltaVarint3(&p1,pcVar3,bDescDoclist,&i1);
        }
        else {
          fts3PutDeltaVarint3(&local_68,bDescDoclist,&iPrev,&bFirstOut,i2);
          fts3PoslistCopy(&local_68,&p2);
          fts3GetDeltaVarint3(&p2,pEnd,bDescDoclist,&i2);
        }
      }
      else {
        fts3PutDeltaVarint3(&local_68,bDescDoclist,&iPrev,&bFirstOut,i1);
        iVar2 = fts3PoslistMerge(&local_68,&p1,&p2);
        if (iVar2 != 0) {
          sqlite3_free(p);
          p = (char *)0x0;
          pcVar3 = (char *)0x0;
          goto LAB_001b2d11;
        }
        fts3GetDeltaVarint3(&p1,pcVar3,bDescDoclist,&i1);
        fts3GetDeltaVarint3(&p2,pEnd,bDescDoclist,&i2);
      }
    }
    local_68[0] = '\0';
    local_68[1] = '\0';
    local_68[2] = '\0';
    local_68[3] = '\0';
    local_68[4] = '\0';
    local_68[5] = '\0';
    local_68[6] = '\0';
    local_68[7] = '\0';
    iVar2 = 0;
    pcVar3 = local_68;
LAB_001b2d11:
    *paOut = p;
    *pnOut = (int)pcVar3 - (int)p;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fts3DoclistOrMerge(
  int bDescDoclist,               /* True if arguments are desc */
  char *a1, int n1,               /* First doclist */
  char *a2, int n2,               /* Second doclist */
  char **paOut, int *pnOut        /* OUT: Malloc'd doclist */
){
  int rc = SQLITE_OK;
  sqlite3_int64 i1 = 0;
  sqlite3_int64 i2 = 0;
  sqlite3_int64 iPrev = 0;
  char *pEnd1 = &a1[n1];
  char *pEnd2 = &a2[n2];
  char *p1 = a1;
  char *p2 = a2;
  char *p;
  char *aOut;
  int bFirstOut = 0;

  *paOut = 0;
  *pnOut = 0;

  /* Allocate space for the output. Both the input and output doclists
  ** are delta encoded. If they are in ascending order (bDescDoclist==0),
  ** then the first docid in each list is simply encoded as a varint. For
  ** each subsequent docid, the varint stored is the difference between the
  ** current and previous docid (a positive number - since the list is in
  ** ascending order).
  **
  ** The first docid written to the output is therefore encoded using the
  ** same number of bytes as it is in whichever of the input lists it is
  ** read from. And each subsequent docid read from the same input list
  ** consumes either the same or less bytes as it did in the input (since
  ** the difference between it and the previous value in the output must
  ** be a positive value less than or equal to the delta value read from
  ** the input list). The same argument applies to all but the first docid
  ** read from the 'other' list. And to the contents of all position lists
  ** that will be copied and merged from the input to the output.
  **
  ** However, if the first docid copied to the output is a negative number,
  ** then the encoding of the first docid from the 'other' input list may
  ** be larger in the output than it was in the input (since the delta value
  ** may be a larger positive integer than the actual docid).
  **
  ** The space required to store the output is therefore the sum of the
  ** sizes of the two inputs, plus enough space for exactly one of the input
  ** docids to grow.
  **
  ** A symetric argument may be made if the doclists are in descending
  ** order.
  */
  aOut = sqlite3_malloc64((i64)n1+n2+FTS3_VARINT_MAX-1+FTS3_BUFFER_PADDING);
  if( !aOut ) return SQLITE_NOMEM;

  p = aOut;
  fts3GetDeltaVarint3(&p1, pEnd1, 0, &i1);
  fts3GetDeltaVarint3(&p2, pEnd2, 0, &i2);
  while( p1 || p2 ){
    sqlite3_int64 iDiff = DOCID_CMP(i1, i2);

    if( p2 && p1 && iDiff==0 ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      rc = fts3PoslistMerge(&p, &p1, &p2);
      if( rc ) break;
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }else if( !p2 || (p1 && iDiff<0) ){
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i1);
      fts3PoslistCopy(&p, &p1);
      fts3GetDeltaVarint3(&p1, pEnd1, bDescDoclist, &i1);
    }else{
      fts3PutDeltaVarint3(&p, bDescDoclist, &iPrev, &bFirstOut, i2);
      fts3PoslistCopy(&p, &p2);
      fts3GetDeltaVarint3(&p2, pEnd2, bDescDoclist, &i2);
    }

    assert( (p-aOut)<=((p1?(p1-a1):n1)+(p2?(p2-a2):n2)+FTS3_VARINT_MAX-1) );
  }

  if( rc!=SQLITE_OK ){
    sqlite3_free(aOut);
    p = aOut = 0;
  }else{
    assert( (p-aOut)<=n1+n2+FTS3_VARINT_MAX-1 );
    memset(&aOut[(p-aOut)], 0, FTS3_BUFFER_PADDING);
  }
  *paOut = aOut;
  *pnOut = (int)(p-aOut);
  return rc;
}